

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

double __thiscall ClipperLib::Int128::AsDouble(Int128 *this)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  uVar1 = this->hi;
  lVar2 = this->lo;
  if ((long)uVar1 < 0) {
    uVar3 = ~uVar1;
    if (lVar2 == 0) {
      uVar3 = -uVar1;
    }
    dVar4 = -(double)(long)uVar3;
    if (lVar2 < 1) {
      return dVar4 * 1.8446744073709552e+19 - (double)-lVar2;
    }
    dVar5 = (double)-lVar2 + -9.223372036854776e+18;
  }
  else {
    if (lVar2 < 0) {
      dVar5 = 9.223372036854776e+18 - (double)lVar2;
    }
    else {
      dVar5 = (double)lVar2;
    }
    dVar4 = (double)(long)uVar1;
  }
  return dVar4 * 1.8446744073709552e+19 + dVar5;
}

Assistant:

double AsDouble() const
    {
      const double shift64 = 18446744073709551616.0; //2^64
      const double bit64 = 9223372036854775808.0;
      if (hi < 0)
      {
        Int128 tmp(*this);
        Negate(tmp);
        if (tmp.lo < 0)
          return (double)tmp.lo - bit64 - tmp.hi * shift64;
        else
          return -(double)tmp.lo - tmp.hi * shift64;
      }
      else if (lo < 0)
        return -(double)lo + bit64 + hi * shift64;
      else
        return (double)lo + (double)hi * shift64;
    }